

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Platform.cpp
# Opt level: O1

uint8_t __thiscall
GmmLib::PlatformInfoGen11::CheckFmtDisplayDecompressible
          (PlatformInfoGen11 *this,GMM_TEXTURE_INFO *Surf,bool IsSupportedRGB64_16_16_16_16,
          bool IsSupportedRGB32_8_8_8_8,bool IsSupportedRGB32_2_10_10_10,
          bool IsSupportedMediaFormats)

{
  PRODUCT_FAMILY PVar1;
  bool bVar2;
  
  PVar1 = (((this->super_PlatformInfoGen10).super_PlatformInfo.pGmmLibContext)->pPlatformInfo->Data)
          .Platform.eProductFamily;
  if (PVar1 == IGFX_LAKEFIELD) {
    if ((((Surf->Flags).Gpu.field_0x2 & 1) == 0) || (((Surf->Flags).Info.field_0x4 & 0x10) == 0)) {
      bVar2 = false;
    }
    else {
      bVar2 = Surf->Format == GMM_FORMAT_P010 || Surf->Format == GMM_FORMAT_NV12;
    }
    if (IsSupportedRGB64_16_16_16_16) {
      bVar2 = true;
    }
    if (IsSupportedRGB32_2_10_10_10) {
      bVar2 = true;
    }
    if (IsSupportedRGB32_8_8_8_8) {
      bVar2 = true;
    }
  }
  else {
    bVar2 = PVar1 == IGFX_ICELAKE && IsSupportedRGB64_16_16_16_16 || IsSupportedRGB32_8_8_8_8;
  }
  return bVar2;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen11::CheckFmtDisplayDecompressible(GMM_TEXTURE_INFO &Surf,
                                                                 bool              IsSupportedRGB64_16_16_16_16,
                                                                 bool              IsSupportedRGB32_8_8_8_8,
                                                                 bool              IsSupportedRGB32_2_10_10_10,
                                                                 bool              IsSupportedMediaFormats)
{
    bool IsRenderCompressed = false;
    bool IsMediaCompressed  = false;
    GMM_UNREFERENCED_PARAMETER(IsSupportedMediaFormats);

    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_LAKEFIELD)
    {
        if(Surf.Flags.Gpu.MMC &&
           Surf.Flags.Info.TiledY &&
           (Surf.Format == GMM_FORMAT_NV12 ||
            Surf.Format == GMM_FORMAT_P010))
        {
            IsMediaCompressed = true;
        }

        if(IsSupportedRGB64_16_16_16_16 || //RGB64 16:16 : 16 : 16 FP16
           IsSupportedRGB32_8_8_8_8 ||     //RGB32 8 : 8 : 8 : 8
           IsSupportedRGB32_2_10_10_10)    //RGB32 2 : 10 : 10 : 10
        {
            IsRenderCompressed = true;
        }
    }
    else
    {
        // Pre-LKF1
        if(IsSupportedRGB32_8_8_8_8 || //RGB32 8 : 8 : 8 : 8
           (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_ICELAKE &&
            IsSupportedRGB64_16_16_16_16)) //RGB64 16:16 : 16 : 16 FP16
        {
            IsRenderCompressed = true;
        }
    }
    return IsRenderCompressed || IsMediaCompressed;
}